

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O0

AggregateInitialiserList * __thiscall
soul::HEARTGenerator::createAggregateInitialiserList
          (HEARTGenerator *this,Context *context,Type *targetType,CommaSeparatedList *list)

{
  bool bVar1;
  pool_ref<soul::AST::Expression> *ppVar2;
  Structure *this_00;
  Type *pTVar3;
  Expression *pEVar4;
  Expression *source;
  ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *this_01;
  Expression *o;
  pool_ref<soul::heart::Expression> local_c8;
  undefined1 local_c0 [8];
  Type elementType;
  pool_ref<soul::AST::Expression> *item;
  pool_ref<soul::AST::Expression> *__end2;
  pool_ref<soul::AST::Expression> *__begin2;
  pool_ptr<soul::AST::Expression> local_80;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> local_78;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *local_40;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *__range2;
  AggregateInitialiserList *pAStack_30;
  uint32_t index;
  AggregateInitialiserList *result;
  CommaSeparatedList *list_local;
  Type *targetType_local;
  Context *context_local;
  HEARTGenerator *this_local;
  
  result = (AggregateInitialiserList *)list;
  list_local = (CommaSeparatedList *)targetType;
  targetType_local = (Type *)context;
  context_local = (Context *)this;
  pAStack_30 = heart::Allocator::
               allocate<soul::heart::AggregateInitialiserList,soul::CodeLocation_const&,soul::Type_const&>
                         (this->module->allocator,&context->location,targetType);
  __range2._4_4_ = 0;
  pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::CommaSeparatedList,void>
            (&local_80,(CommaSeparatedList *)result);
  AST::CommaSeparatedList::getAsExpressionList(&local_78,&local_80);
  pool_ptr<soul::AST::Expression>::~pool_ptr(&local_80);
  local_40 = &local_78;
  __end2 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::begin(local_40);
  ppVar2 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::end(local_40);
  for (; __end2 != ppVar2; __end2 = __end2 + 1) {
    elementType.structure.object = (Structure *)__end2;
    bVar1 = Type::isStruct((Type *)list_local);
    if (bVar1) {
      this_00 = Type::getStructRef((Type *)list_local);
      pTVar3 = Structure::getMemberType(this_00,(ulong)__range2._4_4_);
      Type::Type((Type *)local_c0,pTVar3);
    }
    else {
      Type::getElementType((Type *)local_c0,(Type *)list_local);
    }
    pEVar4 = pool_ref<soul::AST::Expression>::operator->
                       ((pool_ref<soul::AST::Expression> *)elementType.structure.object);
    source = pool_ref::operator_cast_to_Expression_((pool_ref *)elementType.structure.object);
    SanityCheckPass::expectSilentCastPossible
              (&(pEVar4->super_Statement).super_ASTObject.context,(Type *)local_c0,source);
    this_01 = &pAStack_30->items;
    pEVar4 = pool_ref::operator_cast_to_Expression_((pool_ref *)elementType.structure.object);
    o = evaluateAsExpression(this,pEVar4,(Type *)local_c0);
    pool_ref<soul::heart::Expression>::pool_ref<soul::heart::Expression,void>(&local_c8,o);
    ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::push_back
              (this_01,&local_c8);
    pool_ref<soul::heart::Expression>::~pool_ref(&local_c8);
    __range2._4_4_ = __range2._4_4_ + 1;
    Type::~Type((Type *)local_c0);
  }
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::~ArrayWithPreallocation
            (&local_78);
  return pAStack_30;
}

Assistant:

heart::AggregateInitialiserList& createAggregateInitialiserList (const AST::Context& context, const Type& targetType, AST::CommaSeparatedList& list)
    {
        auto& result = module.allocator.allocate<heart::AggregateInitialiserList> (context.location, targetType);
        uint32_t index = 0;

        for (auto& item : AST::CommaSeparatedList::getAsExpressionList (list))
        {
            auto elementType = targetType.isStruct() ? targetType.getStructRef().getMemberType (index)
                                                     : targetType.getElementType();

            SanityCheckPass::expectSilentCastPossible (item->context, elementType, item);
            result.items.push_back (evaluateAsExpression (item, elementType));
            ++index;
        }

        return result;
    }